

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetaction.cpp
# Opt level: O0

void __thiscall QWidgetAction::releaseWidget(QWidgetAction *this,QWidget *widget)

{
  long lVar1;
  bool bVar2;
  QWidgetActionPrivate *this_00;
  Function in_RSI;
  QPointer<QWidget> *in_RDI;
  long in_FS_OFFSET;
  offset_in_QObject_to_subr unaff_retaddr;
  QWidgetActionPrivate *d;
  QListSpecialMethodsBase<QWidget_*> *in_stack_ffffffffffffffc0;
  code *this_01;
  QWidget *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QWidgetAction *)0x4b0efe);
  bVar2 = ::operator==((QWidget **)in_stack_ffffffffffffffc0,in_RDI);
  if (bVar2) {
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0x4b0f30);
    QWidget::hide((QWidget *)0x4b0f38);
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0x4b0f49);
    QWidget::setParent((QWidget *)this_00,in_stack_ffffffffffffffd8);
    this_00->field_0x1d0 = this_00->field_0x1d0 & 0xfe;
  }
  else {
    bVar2 = QListSpecialMethodsBase<QWidget*>::contains<QWidget*>
                      (in_stack_ffffffffffffffc0,(QWidget **)in_RDI);
    if (bVar2) {
      this_01 = QWidgetActionPrivate::widgetDestroyed;
      QObjectPrivate::disconnect<void(QObject::*)(QObject*),void(QWidgetActionPrivate::*)(QObject*)>
                ((Object *)0x0,unaff_retaddr,(Object *)QWidgetActionPrivate::widgetDestroyed,in_RSI)
      ;
      QList<QWidget*>::removeAll<QWidget*>((QList<QWidget_*> *)this_01,(QWidget **)in_RDI);
      (**(code **)((in_RDI->wp).d + 0x68))(in_RDI,in_RSI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetAction::releaseWidget(QWidget *widget)
{
    Q_D(QWidgetAction);

    if (widget == d->defaultWidget) {
        d->defaultWidget->hide();
        d->defaultWidget->setParent(nullptr);
        d->defaultWidgetInUse = false;
        return;
    }

    if (!d->createdWidgets.contains(widget))
        return;

    QObjectPrivate::disconnect(widget, &QWidget::destroyed,
                               d, &QWidgetActionPrivate::widgetDestroyed);
    d->createdWidgets.removeAll(widget);
    deleteWidget(widget);
}